

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-features.h
# Opt level: O0

string * __thiscall
wasm::FeatureSet::toString_abi_cxx11_(string *__return_storage_ptr__,FeatureSet *this,Feature f)

{
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  Feature f_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"threads",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else if (local_14 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"mutable-globals",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  else if (local_14 == 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"nontrapping-float-to-int",&local_26);
    std::allocator<char>::~allocator(&local_26);
  }
  else if (local_14 == 8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"simd",&local_27);
    std::allocator<char>::~allocator(&local_27);
  }
  else if (local_14 == 0x10) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"bulk-memory",&local_28);
    std::allocator<char>::~allocator(&local_28);
  }
  else if (local_14 == 0x20) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"sign-ext",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else if (local_14 == 0x40) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"exception-handling",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
  }
  else if (local_14 == 0x80) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"tail-call",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
  }
  else if (local_14 == 0x100) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"reference-types",&local_2c);
    std::allocator<char>::~allocator(&local_2c);
  }
  else if (local_14 == 0x200) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"multivalue",&local_2d);
    std::allocator<char>::~allocator(&local_2d);
  }
  else if (local_14 == 0x400) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"gc",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
  }
  else if (local_14 == 0x800) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"memory64",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
  }
  else if (local_14 == 0x1000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"gc-nn-locals",&local_30);
    std::allocator<char>::~allocator(&local_30);
  }
  else if (local_14 == 0x2000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"relaxed-simd",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  else if (local_14 == 0x4000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"extended-const",&local_32);
    std::allocator<char>::~allocator(&local_32);
  }
  else if (local_14 == 0x8000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"strings",&local_33);
    std::allocator<char>::~allocator(&local_33);
  }
  else {
    if (local_14 != 0x10000) {
      wasm::handle_unreachable
                ("unexpected feature",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-features.h"
                 ,0x61);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"multi-memories",&local_34);
    std::allocator<char>::~allocator(&local_34);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string toString(Feature f) {
    switch (f) {
      case Atomics:
        return "threads";
      case MutableGlobals:
        return "mutable-globals";
      case TruncSat:
        return "nontrapping-float-to-int";
      case SIMD:
        return "simd";
      case BulkMemory:
        return "bulk-memory";
      case SignExt:
        return "sign-ext";
      case ExceptionHandling:
        return "exception-handling";
      case TailCall:
        return "tail-call";
      case ReferenceTypes:
        return "reference-types";
      case Multivalue:
        return "multivalue";
      case GC:
        return "gc";
      case Memory64:
        return "memory64";
      case GCNNLocals:
        return "gc-nn-locals";
      case RelaxedSIMD:
        return "relaxed-simd";
      case ExtendedConst:
        return "extended-const";
      case Strings:
        return "strings";
      case MultiMemories:
        return "multi-memories";
      default:
        WASM_UNREACHABLE("unexpected feature");
    }
  }